

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O3

void __thiscall
mocker::detail::ReassociationImpl::rebuild
          (ReassociationImpl *this,
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
          *q,iterator pos)

{
  bool bVar1;
  pointer pRVar2;
  pointer pRVar3;
  FunctionModule *pFVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int64_t iVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined1 uVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  Addr *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  Addr AVar12;
  undefined1 auVar13 [8];
  shared_ptr<mocker::ir::ArithBinaryInst> newInst;
  value_type val;
  bool local_fc [4];
  _List_node_base *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  _List_node_base local_e8;
  shared_ptr<mocker::ir::Addr> local_d8;
  undefined1 local_c8 [8];
  IntLiteral IStack_c0;
  int local_b0;
  undefined1 local_99;
  undefined1 local_98 [8];
  IntLiteral IStack_90;
  int local_80;
  shared_ptr<mocker::ir::Reg> local_78;
  __node_base local_60;
  int local_58;
  undefined4 uStack_54;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_40;
  pointer local_38;
  
  local_60._M_nxt = (_Hash_node_base *)this->bb;
  local_38 = (pointer)(pos._M_node + 1);
  local_40 = this;
  ir::getDest((ir *)&local_78,(shared_ptr<mocker::ir::IRInst> *)local_38);
  pRVar2 = (q->c).
           super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (q->c).
           super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pRVar3 - (long)pRVar2 == 0x20) {
    bVar1 = pRVar2->positive;
    local_98[0] = (ir)bVar1;
    IStack_90.super_Addr._vptr_Addr =
         (_func_int **)
         (pRVar2->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    IStack_90.val =
         (int64_t)(pRVar2->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((pointer)IStack_90.val != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((pointer)IStack_90.val)->_M_string_length =
             (int)((pointer)IStack_90.val)->_M_string_length + 1;
        UNLOCK();
      }
      else {
        *(int *)&((pointer)IStack_90.val)->_M_string_length =
             (int)((pointer)IStack_90.val)->_M_string_length + 1;
      }
    }
    local_80 = pRVar2->rank;
    if ((bVar1 & 1U) == 0) {
      local_f8 = (_List_node_base *)((ulong)local_f8 & 0xffffffff00000000);
      local_c8 = (undefined1  [8])0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::ArithUnaryInst,std::allocator<mocker::ir::ArithUnaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),
                 (ArithUnaryInst **)local_c8,(allocator<mocker::ir::ArithUnaryInst> *)&local_d8,
                 &local_78,(OpType *)&local_f8,(shared_ptr<mocker::ir::Addr> *)&IStack_90);
      AVar12._vptr_Addr = IStack_c0.super_Addr._vptr_Addr;
      auVar13 = local_c8;
      local_c8 = (undefined1  [8])0x0;
      IStack_c0.super_Addr._vptr_Addr = (_func_int **)0x0;
      p_Var11 = (_List_node_base *)operator_new(0x20);
    }
    else {
      local_c8 = (undefined1  [8])0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Assign,std::allocator<mocker::ir::Assign>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),(Assign **)local_c8,
                 (allocator<mocker::ir::Assign> *)&local_f8,&local_78,
                 (shared_ptr<mocker::ir::Addr> *)&IStack_90);
      AVar12._vptr_Addr = IStack_c0.super_Addr._vptr_Addr;
      auVar13 = local_c8;
      local_c8 = (undefined1  [8])0x0;
      IStack_c0.super_Addr._vptr_Addr = (_func_int **)0x0;
      p_Var11 = (_List_node_base *)operator_new(0x20);
    }
    p_Var11[1]._M_next = (_List_node_base *)auVar13;
    p_Var11[1]._M_prev = (_List_node_base *)AVar12._vptr_Addr;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    local_60._M_nxt[3] = (_Hash_node_base)(*(size_t *)(local_60._M_nxt + 3) + 1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.super_Addr._vptr_Addr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.super_Addr._vptr_Addr);
    }
LAB_0016f2de:
    if ((pointer)IStack_90.val != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val);
    }
  }
  else if (pRVar2 != pRVar3) {
    do {
      ir::getDest((ir *)local_98,(shared_ptr<mocker::ir::IRInst> *)local_38);
      _Var5._M_pi = local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.super_Addr._vptr_Addr;
      local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_98;
      local_98 = (undefined1  [8])0x0;
      IStack_90.super_Addr._vptr_Addr = (_func_int **)0x0;
      if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.super_Addr._vptr_Addr !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.super_Addr._vptr_Addr);
      }
      pRVar2 = (q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98[0] = (ir)pRVar2->positive;
      IStack_90.super_Addr._vptr_Addr =
           (_func_int **)
           (pRVar2->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      IStack_90.val =
           (int64_t)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(pRVar2->value).
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> + 8))->
                    _M_pi;
      if ((pointer)IStack_90.val != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((pointer)IStack_90.val)->_M_string_length =
               (int)((pointer)IStack_90.val)->_M_string_length + 1;
          UNLOCK();
        }
        else {
          *(int *)&((pointer)IStack_90.val)->_M_string_length =
               (int)((pointer)IStack_90.val)->_M_string_length + 1;
        }
      }
      local_80 = pRVar2->rank;
      std::
      priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
      ::pop(q);
      pRVar2 = (q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar2 == (q->c).
                    super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0016f2de;
      local_c8[0] = pRVar2->positive;
      IStack_c0.super_Addr._vptr_Addr =
           (_func_int **)
           (pRVar2->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      IStack_c0.val =
           (int64_t)(pRVar2->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if ((pointer)IStack_c0.val != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((pointer)IStack_c0.val)->_M_string_length =
               (int)((pointer)IStack_c0.val)->_M_string_length + 1;
          UNLOCK();
        }
        else {
          *(int *)&((pointer)IStack_c0.val)->_M_string_length =
               (int)((pointer)IStack_c0.val)->_M_string_length + 1;
        }
      }
      local_b0 = pRVar2->rank;
      std::
      priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
      ::pop(q);
      ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                ((shared_ptr<mocker::ir::Addr> *)&local_f8,&IStack_90);
      if (local_f8 != (_List_node_base *)0x0) {
        ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                  (&local_d8,(IntLiteral *)(local_c8 + 8));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          __assert_fail("!ir::dyc<ir::IntLiteral>(lhs.value) || !ir::dyc<ir::IntLiteral>(rhs.value)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                        ,0x132,
                        "void mocker::detail::ReassociationImpl::rebuild(std::priority_queue<detail::ReassociationImpl::RankedNode> &, std::list<std::shared_ptr<ir::IRInst>>::iterator)"
                       );
        }
        if (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
      }
      if ((q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pFVar4 = *(FunctionModule **)(local_40 + 8);
        local_f8 = &local_e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
        ir::FunctionModule::makeTempLocalReg((FunctionModule *)&local_d8,&pFVar4->identifier);
        _Var5._M_pi = local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
           local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,(ulong)((long)&(local_e8._M_next)->_M_next + 1));
        }
      }
      iVar7 = local_80;
      iVar6 = IStack_90.val;
      AVar12._vptr_Addr = IStack_90.super_Addr._vptr_Addr;
      uVar9 = local_98[0];
      if (local_98[0] == (ir)0x0) {
        uVar9 = local_c8[0];
        local_98[0] = (ir)local_c8[0];
        IStack_90.super_Addr._vptr_Addr = IStack_c0.super_Addr._vptr_Addr;
        IStack_90.val = IStack_c0.val;
        local_80 = local_b0;
        local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffffffffff00);
        IStack_c0.super_Addr._vptr_Addr = AVar12._vptr_Addr;
        IStack_c0.val = iVar6;
        local_b0 = iVar7;
      }
      if ((pointer)IStack_90.val != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(IStack_90.val + 8) = (int)*(size_type *)(IStack_90.val + 8) + 1;
          UNLOCK();
          uVar9 = local_98[0];
        }
        else {
          *(int *)(IStack_90.val + 8) = (int)*(size_type *)(IStack_90.val + 8) + 1;
        }
      }
      local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)IStack_90.super_Addr._vptr_Addr;
      local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val;
      if ((uVar9 & 1) == 0) {
        pFVar4 = *(FunctionModule **)(local_40 + 8);
        local_f8 = &local_e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
        ir::FunctionModule::makeTempLocalReg
                  ((FunctionModule *)&stack0xffffffffffffffa8,&pFVar4->identifier);
        p_Var8 = p_Stack_50;
        local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_local_58;
        _Var5._M_pi = local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        _local_58 = (pointer)0x0;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = p_Var8;
        if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
           p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,(ulong)((long)&(local_e8._M_next)->_M_next + 1));
        }
        ir::dycLocalReg((ir *)&stack0xffffffffffffffa8,&local_d8);
        local_fc[0] = false;
        local_fc[1] = false;
        local_fc[2] = false;
        local_fc[3] = false;
        local_f8 = (_List_node_base *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::ir::ArithUnaryInst,std::allocator<mocker::ir::ArithUnaryInst>,std::shared_ptr<mocker::ir::Reg>,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                  (&local_f0,(ArithUnaryInst **)&local_f8,
                   (allocator<mocker::ir::ArithUnaryInst> *)&local_99,
                   (shared_ptr<mocker::ir::Reg> *)&stack0xffffffffffffffa8,(OpType *)local_fc,
                   (shared_ptr<mocker::ir::Addr> *)&IStack_90);
        if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        }
        _Var5._M_pi = local_f0._M_pi;
        p_Var11 = local_f8;
        if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
          }
        }
        p_Var10 = (_List_node_base *)operator_new(0x20);
        p_Var10[1]._M_next = p_Var11;
        p_Var10[1]._M_prev = (_List_node_base *)_Var5._M_pi;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        local_60._M_nxt[3] = (_Hash_node_base)(*(size_t *)(local_60._M_nxt + 3) + 1);
        if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
        }
      }
      local_58 = 6 - (uint)(byte)local_c8[0];
      local_f8 = (_List_node_base *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                (&local_f0,(ArithBinaryInst **)&local_f8,
                 (allocator<mocker::ir::ArithBinaryInst> *)local_fc,&local_78,
                 (OpType *)&stack0xffffffffffffffa8,&local_d8,
                 (shared_ptr<mocker::ir::Addr> *)(local_c8 + 8));
      _Var5._M_pi = local_f0._M_pi;
      p_Var11 = local_f8;
      if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
        }
      }
      p_Var10 = (_List_node_base *)operator_new(0x20);
      p_Var10[1]._M_next = p_Var11;
      p_Var10[1]._M_prev = (_List_node_base *)_Var5._M_pi;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      local_60._M_nxt[3] = (_Hash_node_base)(*(size_t *)(local_60._M_nxt + 3) + 1);
      if ((q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_fc[0] = true;
        local_58 = local_b0 + local_80;
        std::
        priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
        ::emplace<bool,std::shared_ptr<mocker::ir::Reg>&,int>
                  ((priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
                    *)q,local_fc,&local_78,&stack0xffffffffffffffa8);
      }
      if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
      }
      if (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((pointer)IStack_c0.val != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val);
      }
      if ((pointer)IStack_90.val != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val);
      }
    } while ((q->c).
             super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (q->c).
             super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void detail::ReassociationImpl::rebuild(
    std::priority_queue<detail::ReassociationImpl::RankedNode> &q,
    std::list<std::shared_ptr<ir::IRInst>>::iterator pos) {
  auto &insts = bb.getMutableInsts();
  auto dest = ir::getDest(*pos);

  //  std::cerr << "rebuilding: " <<  ir::fmtAddr(dest) << std::endl;

  if (q.size() == 1) {
    auto val = q.top();
    if (val.positive)
      insts.insert(pos, std::make_shared<ir::Assign>(dest, val.value));
    else
      insts.insert(pos, std::make_shared<ir::ArithUnaryInst>(
                            dest, ir::ArithUnaryInst::Neg, val.value));
    return;
  }

  while (!q.empty()) {
    dest = ir::getDest(*pos);
    auto lhs = q.top();
    q.pop();
    if (q.empty())
      return;
    auto rhs = q.top();
    q.pop();

    assert(!ir::dyc<ir::IntLiteral>(lhs.value) ||
           !ir::dyc<ir::IntLiteral>(rhs.value));

    if (!q.empty())
      dest = func.makeTempLocalReg();

    // emit
    if (!lhs.positive)
      std::swap(lhs, rhs);
    auto lhsVal = lhs.value;
    if (!lhs.positive) {
      lhsVal = func.makeTempLocalReg();
      auto newInst = std::make_shared<ir::ArithUnaryInst>(
          ir::dycLocalReg(lhsVal), ir::ArithUnaryInst::Neg, lhs.value);
      insts.insert(pos, newInst);
    }
    auto newInst = std::make_shared<ir::ArithBinaryInst>(
        dest,
        rhs.positive ? ir::ArithBinaryInst::Add : ir::ArithBinaryInst::Sub,
        lhsVal, rhs.value);
    insts.insert(pos, newInst);
    if (!q.empty()) {
      q.emplace(true, dest, lhs.rank + rhs.rank);
    }
  }
}